

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkDfsIter(Abc_Ntk_t *pNtk,int fCollectAll)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes = Vec_PtrAlloc(1000);
  p = Vec_PtrAlloc(1000);
  for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = Abc_NtkCo(pNtk,iVar3);
    Abc_NodeSetTravIdCurrent(pAVar2);
    pAVar2 = Abc_ObjFanin0Ntk((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
    Abc_NtkDfs_iter(p,pAVar2,vNodes);
  }
  if (fCollectAll != 0) {
    for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkObj(pNtk,iVar3);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        iVar1 = Abc_NodeIsTravIdCurrent(pAVar2);
        if (iVar1 == 0) {
          Abc_NtkDfs_iter(p,pAVar2,vNodes);
        }
      }
    }
  }
  Vec_PtrFree(p);
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsIter( Abc_Ntk_t * pNtk, int fCollectAll )
{
    Vec_Ptr_t * vNodes, * vStack;
    Abc_Obj_t * pObj;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 1000 );
    vStack = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        Abc_NtkDfs_iter( vStack, Abc_ObjFanin0Ntk(Abc_ObjFanin0(pObj)), vNodes );
    }
    // collect dangling nodes if asked to
    if ( fCollectAll )
    { 
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( !Abc_NodeIsTravIdCurrent(pObj) )
                Abc_NtkDfs_iter( vStack, pObj, vNodes );
    }
    Vec_PtrFree( vStack );
    return vNodes;
}